

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  ColourImpl *pCVar2;
  ColourGuard *rhs;
  ColourGuard local_40;
  undefined1 local_30 [8];
  ColourGuard guard;
  string *_name_local;
  ConsoleReporter *this_local;
  
  poVar1 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  lineOfChars::lineOfChars((lineOfChars *)&guard.field_0xf,'-');
  poVar1 = Catch::operator<<(poVar1,(lineOfChars)guard._15_1_);
  std::operator<<(poVar1,'\n');
  pCVar2 = Detail::unique_ptr<Catch::ColourImpl>::operator->
                     (&(this->super_StreamingReporterBase).super_ReporterBase.m_colour);
  ColourImpl::guardColour((ColourImpl *)&local_40,(Code)pCVar2);
  rhs = ColourImpl::ColourGuard::engage
                  (&local_40,(this->super_StreamingReporterBase).super_ReporterBase.m_stream);
  ColourImpl::ColourGuard::ColourGuard((ColourGuard *)local_30,rhs);
  ColourImpl::ColourGuard::~ColourGuard(&local_40);
  printHeaderString(this,_name,0);
  ColourImpl::ColourGuard::~ColourGuard((ColourGuard *)local_30);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    m_stream << lineOfChars('-') << '\n';
    {
        auto guard = m_colour->guardColour( Colour::Headers ).engage( m_stream );
        printHeaderString(_name);
    }
}